

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::UninterpretedOption::_InternalParse
          (UninterpretedOption *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  UninterpretedOption_NamePart *msg;
  char cVar5;
  uint32 uVar6;
  uint tag;
  char cVar7;
  ArenaStringPtr *this_00;
  Arena *arena;
  uint uVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  pair<const_char_*,_bool> pVar11;
  
  uVar8 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar11._8_8_ = 0;
      pVar11.first = ptr;
    }
    else {
      pVar11._8_8_ = 1;
      pVar11.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar11 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar11.first;
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_003046da;
    bVar1 = *ptr;
    pVar9.second._0_1_ = bVar1;
    pVar9.first = (char *)((long)ptr + 1);
    pVar9._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = *(byte *)((long)ptr + 1);
      uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar9 = internal::ReadTagFallback(ptr,uVar6);
      }
      else {
        pVar9.second = uVar6;
        pVar9.first = (char *)((long)ptr + 2);
        pVar9._12_4_ = 0;
      }
    }
    ptr = pVar9.first;
    cVar7 = '\x04';
    if ((double *)ptr != (double *)0x0) {
      tag = pVar9.second;
      cVar5 = (char)pVar9.second;
      switch((uint)(pVar9._8_8_ >> 3) & 0x1fffffff) {
      case 2:
        if (cVar5 == '\x12') {
          ptr = (char *)((long)ptr + -1);
          do {
            pRVar4 = (this->name_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar4 == (Rep *)0x0) {
LAB_00304450:
              internal::RepeatedPtrFieldBase::Reserve
                        (&(this->name_).super_RepeatedPtrFieldBase,
                         (this->name_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0030445f:
              pRVar4 = (this->name_).super_RepeatedPtrFieldBase.rep_;
              pRVar4->allocated_size = pRVar4->allocated_size + 1;
              msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption_NamePart>
                              ((this->name_).super_RepeatedPtrFieldBase.arena_);
              pRVar4 = (this->name_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
              (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar4->elements[iVar3] = msg;
            }
            else {
              iVar3 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar4->allocated_size <= iVar3) {
                if (pRVar4->allocated_size == (this->name_).super_RepeatedPtrFieldBase.total_size_)
                goto LAB_00304450;
                goto LAB_0030445f;
              }
              (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (UninterpretedOption_NamePart *)pRVar4->elements[iVar3];
            }
            ptr = internal::ParseContext::
                  ParseMessage<google::protobuf::UninterpretedOption_NamePart>
                            (ctx,msg,(char *)((long)ptr + 1));
            if ((double *)ptr == (double *)0x0) goto LAB_00304673;
          } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*ptr == 0x12));
LAB_003044e4:
          cVar7 = '\x02';
          goto LAB_00304673;
        }
        break;
      case 3:
        if (cVar5 != '\x1a') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        arena = (Arena *)(this->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
        this_00 = &this->identifier_value_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
LAB_003045cb:
        if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        ptr = internal::InlineGreedyStringParser(this_00->ptr_,ptr,ctx);
        goto LAB_003045f6;
      case 4:
        if (cVar5 == ' ') {
          bVar1 = *ptr;
          pVar10.second = (long)(char)bVar1;
          pVar10.first = (char *)((long)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = *(byte *)((long)ptr + 1);
            uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar10 = internal::VarintParseSlow64(ptr,uVar6);
            }
            else {
              pVar10.second._0_4_ = uVar6;
              pVar10.first = (char *)((long)ptr + 2);
              pVar10.second._4_4_ = 0;
            }
          }
          uVar8 = uVar8 | 8;
          this->positive_int_value_ = pVar10.second;
LAB_00304661:
          ptr = pVar10.first;
          cVar7 = ((double *)ptr == (double *)0x0) * '\x02' + '\x02';
          goto LAB_00304673;
        }
        break;
      case 5:
        if (cVar5 == '(') {
          bVar1 = *ptr;
          pVar10.second = (long)(char)bVar1;
          pVar10.first = (char *)((long)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = *(byte *)((long)ptr + 1);
            uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar10 = internal::VarintParseSlow64(ptr,uVar6);
            }
            else {
              pVar10.second._0_4_ = uVar6;
              pVar10.first = (char *)((long)ptr + 2);
              pVar10.second._4_4_ = 0;
            }
          }
          uVar8 = uVar8 | 0x10;
          this->negative_int_value_ = pVar10.second;
          goto LAB_00304661;
        }
        break;
      case 6:
        if (cVar5 == '1') {
          uVar8 = uVar8 | 0x20;
          this->double_value_ = *(double *)ptr;
          ptr = (char *)((long)ptr + 8);
          goto LAB_003044e4;
        }
        break;
      case 7:
        if (cVar5 == ':') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->string_value_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_003045cb;
        }
        break;
      case 8:
        if (cVar5 == 'B') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          arena = (Arena *)(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           .ptr_;
          this_00 = &this->aggregate_value_;
          if (((ulong)arena & 1) != 0) {
            arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
          }
          goto LAB_003045cb;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar7 = '\t';
      }
      else {
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
LAB_003045f6:
        cVar7 = ((double *)ptr == (double *)0x0) * '\x02' + '\x02';
      }
    }
LAB_00304673:
  } while (cVar7 == '\x02');
  if (cVar7 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_003046da:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar8;
  return (char *)(double *)ptr;
}

Assistant:

const char* UninterpretedOption::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_name(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string identifier_value = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_identifier_value(), ptr, ctx, "google.protobuf.UninterpretedOption.identifier_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 positive_int_value = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_positive_int_value(&has_bits);
          positive_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int64 negative_int_value = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_negative_int_value(&has_bits);
          negative_int_value_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional double double_value = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 49)) {
          _Internal::set_has_double_value(&has_bits);
          double_value_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else goto handle_unusual;
        continue;
      // optional bytes string_value = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(_internal_mutable_string_value(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string aggregate_value = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_aggregate_value(), ptr, ctx, "google.protobuf.UninterpretedOption.aggregate_value");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}